

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O1

wchar_t __thiscall
CVmFormatter::parse_html_markup(CVmFormatter *this,wchar_t c,char **sp,size_t *slenp)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  bool bVar5;
  os_color_t oVar6;
  undefined4 uVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  wchar_t c_00;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  wchar_t tagbuf [50];
  wchar_t dashbuf [100];
  uint local_29c;
  wchar_t local_298 [52];
  wchar_t local_1c8 [102];
  
  if (c == L'&') {
    wVar8 = parse_entity(this,local_1c8,sp,slenp);
    buffer_char(this,local_1c8[0]);
    return wVar8;
  }
  if (c != L'<') {
    buffer_char(this,c);
    wVar8 = next_wchar(sp,slenp);
    return wVar8;
  }
  wVar8 = next_wchar(sp,slenp);
  if ((wVar8 == L'\\') || (wVar8 == L'/')) {
    wVar9 = next_wchar(sp,slenp);
    local_29c = 1;
  }
  else {
    local_29c = 0;
    wVar9 = wVar8;
  }
  lVar15 = 0;
  while ((0x3e < (uint)wVar9 || ((0x4000000100000001U >> ((ulong)(uint)wVar9 & 0x3f) & 1) == 0))) {
    if (lVar15 < 0xc4) {
      *(wchar_t *)((long)local_298 + lVar15) = wVar9;
      lVar15 = lVar15 + 4;
    }
    wVar9 = next_wchar(sp,slenp);
  }
  *(undefined4 *)((long)local_298 + lVar15) = 0;
  iVar10 = CVmCaseFoldStr::wstreq(local_298,L"br");
  if (iVar10 != 0) {
    if (this->html_in_ignore_ == 0) {
      if (this->linepos_ == 0) {
        this->html_defer_br_ = HTML_DEFER_BR_BLANK;
      }
      else {
        this->html_defer_br_ = HTML_DEFER_BR_FLUSH;
      }
    }
    goto LAB_002430f5;
  }
  iVar10 = CVmCaseFoldStr::wstreq(local_298,L"b");
  if ((((iVar10 == 0) && (iVar10 = CVmCaseFoldStr::wstreq(local_298,L"i"), iVar10 == 0)) &&
      (iVar10 = CVmCaseFoldStr::wstreq(local_298,L"em"), iVar10 == 0)) &&
     (iVar10 = CVmCaseFoldStr::wstreq(local_298,L"strong"), iVar10 == 0)) {
    iVar10 = CVmCaseFoldStr::wstreq(local_298,L"p");
    if (iVar10 == 0) {
      iVar10 = CVmCaseFoldStr::wstreq(local_298,L"tab");
      if ((iVar10 != 0) && (this->html_in_ignore_ == 0)) {
        expand_pending_tab(this,1);
        this->field_0xefe8 = this->field_0xefe8 | 8;
        this->new_tab_entry_ = (CVmFmtTabStop *)0x0;
        this->new_tab_align_ = VMFMT_TAB_NONE;
        this->new_tab_dp_ = L'\0';
        goto LAB_002430f5;
      }
      iVar10 = CVmCaseFoldStr::wstreq(local_298,L"img");
      if ((iVar10 != 0) || (iVar10 = CVmCaseFoldStr::wstreq(local_298,L"sound"), iVar10 != 0)) {
        this->field_0xefe8 = this->field_0xefe8 | 1;
        goto LAB_002430f5;
      }
      iVar10 = CVmCaseFoldStr::wstreq(local_298,L"font");
      if (iVar10 != 0) {
        if (this->html_in_ignore_ != 0) goto LAB_002430f5;
        if ((wVar8 != L'/') && (wVar8 != L'\\')) {
          this->field_0xefe8 = this->field_0xefe8 | 2;
          if (this->color_sp_ == 0x19) {
            memmove(this->color_stack_,this->color_stack_ + 1,0x240);
            this->color_sp_ = 0x18;
          }
          sVar4 = this->color_sp_;
          this->color_sp_ = sVar4 + 1;
          uVar7 = *(undefined4 *)&(this->cur_color_).field_0x14;
          this->color_stack_[sVar4].attr = (this->cur_color_).attr;
          *(undefined4 *)&this->color_stack_[sVar4].field_0x14 = uVar7;
          oVar6 = (this->cur_color_).bg;
          this->color_stack_[sVar4].fg = (this->cur_color_).fg;
          this->color_stack_[sVar4].bg = oVar6;
          goto LAB_002430f5;
        }
        goto LAB_0024300a;
      }
      iVar10 = CVmCaseFoldStr::wstreq(local_298,L"body");
      if (iVar10 != 0) {
        if (((this->html_in_ignore_ == 0) && (wVar8 != L'/')) && (wVar8 != L'\\')) {
          this->field_0xefe8 = this->field_0xefe8 | 4;
        }
        goto LAB_002430f5;
      }
      iVar10 = CVmCaseFoldStr::wstreq(local_298,L"hr");
      if (iVar10 == 0) {
        iVar10 = CVmCaseFoldStr::wstreq(local_298,L"q");
        if (iVar10 == 0) {
          iVar10 = CVmCaseFoldStr::wstreq(local_298,L"title");
          if (iVar10 == 0) {
            iVar10 = CVmCaseFoldStr::wstreq(local_298,L"aboutbox");
            if ((iVar10 == 0) && (iVar10 = CVmCaseFoldStr::wstreq(local_298,L"banner"), iVar10 == 0)
               ) {
              iVar10 = CVmCaseFoldStr::wstreq(local_298,L"log");
              if (iVar10 == 0) {
                iVar10 = CVmCaseFoldStr::wstreq(local_298,L"nolog");
                if (iVar10 == 0) {
                  iVar10 = CVmCaseFoldStr::wstreq(local_298,L"wrap");
                  if (iVar10 == 0) {
                    iVar10 = CVmCaseFoldStr::wstreq(local_298,L"pre");
                    if (iVar10 != 0) {
                      if ((wVar8 != L'/') && (wVar8 != L'\\')) {
                        this->html_pre_level_ = this->html_pre_level_ + 1;
                      }
                      write_blank_line(this);
                      if (((wVar8 == L'\\') || (wVar8 == L'/')) && (this->html_pre_level_ != 0)) {
                        this->html_pre_level_ = this->html_pre_level_ + -1;
                      }
                    }
                  }
                  else if (this->html_in_ignore_ == 0) {
                    this->field_0xefe8 = this->field_0xefe8 | 0x10;
                  }
                }
                else {
                  (*this->_vptr_CVmFormatter[0x10])(this,(ulong)local_29c);
                }
              }
              else {
                (*this->_vptr_CVmFormatter[0x11])(this,(ulong)local_29c);
              }
            }
            else if ((wVar8 == L'\\') || (wVar8 == L'/')) {
              this->html_in_ignore_ = this->html_in_ignore_ + -1;
            }
            else {
              this->html_in_ignore_ = this->html_in_ignore_ + 1;
            }
          }
          else if ((wVar8 == L'\\') || (wVar8 == L'/')) {
            uVar2 = this->html_in_ignore_;
            uVar3 = this->html_in_title_;
            this->html_in_ignore_ = uVar2 + -1;
            this->html_in_title_ = uVar3 + -1;
            if ((uVar3 + -1 == 0) &&
               ((this->html_title_ptr_ != (char *)0x0 &&
                (*this->html_title_ptr_ = '\0', this->html_in_ignore_ == 0)))) {
              (*this->_vptr_CVmFormatter[10])(this,this->html_title_buf_);
            }
          }
          else {
            if (this->html_in_title_ == 0) {
              this->html_title_ptr_ = this->html_title_buf_;
            }
            this->html_in_ignore_ = this->html_in_ignore_ + 1;
            this->html_in_title_ = this->html_in_title_ + 1;
          }
        }
        else if (this->html_in_ignore_ == 0) {
          if ((wVar8 == L'/') || (wVar8 == L'\\')) {
            c_00 = ((byte)this->html_quote_level_ & 1) * 4 + L'’';
          }
          else {
            uVar11 = this->html_quote_level_;
            this->html_quote_level_ = uVar11 + 1;
            c_00 = (uint)((uVar11 & 1) == 0) * 4 + L'‘';
          }
          buffer_char(this,c_00);
          if ((wVar8 == L'\\') || (wVar8 == L'/')) {
            this->html_quote_level_ = this->html_quote_level_ + -1;
          }
        }
        goto LAB_002430f5;
      }
      if (this->html_in_ignore_ != 0) goto LAB_002430f5;
      flush(this,VM_NL_NEWLINE);
      iVar10 = (*this->console_->_vptr_CVmConsole[6])();
      if (1 < iVar10) {
        uVar11 = iVar10 - 1;
        do {
          uVar13 = 99;
          if (uVar11 < 99) {
            uVar13 = (ulong)uVar11;
          }
          uVar12 = 0;
          do {
            local_1c8[uVar12] = L'-';
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
          local_1c8[uVar12] = L'\0';
          buffer_wstring(this,local_1c8);
          uVar14 = uVar11 - (int)uVar13;
          bVar5 = (int)uVar13 <= (int)uVar11;
          uVar11 = uVar14;
        } while (uVar14 != 0 && bVar5);
      }
    }
    else if (this->html_in_ignore_ != 0) goto LAB_002430f5;
    write_blank_line(this);
    goto LAB_002430f5;
  }
  if (this->html_in_ignore_ != 0) goto LAB_002430f5;
  if ((wVar8 == L'/') || (wVar8 == L'\\')) {
LAB_0024300a:
    sVar4 = this->color_sp_;
    if (sVar4 != 0) {
      this->color_sp_ = sVar4 - 1;
      oVar6 = this->color_stack_[sVar4 - 1].bg;
      (this->cur_color_).fg = this->color_stack_[sVar4 - 1].fg;
      (this->cur_color_).bg = oVar6;
      uVar7 = *(undefined4 *)&this->color_stack_[sVar4 - 1].field_0x14;
      (this->cur_color_).attr = this->color_stack_[sVar4 - 1].attr;
      *(undefined4 *)&(this->cur_color_).field_0x14 = uVar7;
    }
    goto LAB_002430f5;
  }
  if (this->color_sp_ == 0x19) {
    memmove(this->color_stack_,this->color_stack_ + 1,0x240);
    this->color_sp_ = 0x18;
  }
  sVar4 = this->color_sp_;
  this->color_sp_ = sVar4 + 1;
  uVar7 = *(undefined4 *)&(this->cur_color_).field_0x14;
  this->color_stack_[sVar4].attr = (this->cur_color_).attr;
  *(undefined4 *)&this->color_stack_[sVar4].field_0x14 = uVar7;
  oVar6 = (this->cur_color_).bg;
  this->color_stack_[sVar4].fg = (this->cur_color_).fg;
  this->color_stack_[sVar4].bg = oVar6;
  uVar11 = 1;
  if (local_298[0] < L'i') {
    if (local_298[0] == L'I') {
LAB_002430e6:
      uVar11 = 2;
    }
    else if (local_298[0] == L'S') goto LAB_002430ed;
  }
  else {
    if (local_298[0] != L's') {
      if (local_298[0] != L'i') goto LAB_002430ef;
      goto LAB_002430e6;
    }
LAB_002430ed:
    uVar11 = 0;
  }
LAB_002430ef:
  piVar1 = &(this->cur_color_).attr;
  *piVar1 = *piVar1 | uVar11;
LAB_002430f5:
  this->html_parse_state_ = VMCON_HPS_TAG;
  return wVar9;
}

Assistant:

wchar_t CVmFormatter::parse_html_markup(VMG_ wchar_t c,
                                        const char **sp, size_t *slenp)
{
    /* check what we have */
    if (c == '<')
    {
        const size_t MAX_TAG_SIZE = 50;
        wchar_t tagbuf[MAX_TAG_SIZE];
        wchar_t *dst;
        int is_end_tag;
        
        /* skip the opening '<' */
        c = next_wchar(sp, slenp);
        
        /* note if this is a closing tag */
        if (c == '/' || c == '\\')
        {
            /* it's an end tag - note it and skip the slash */
            is_end_tag = TRUE;
            c = next_wchar(sp, slenp);
        }
        else
            is_end_tag = FALSE;
        
        /* 
         *   find the end of the tag name - the tag continues to the next
         *   space, '>', or end of line 
         */
        for (dst = tagbuf ; c != '\0' && c != ' ' && c != '>' ;
             c = next_wchar(sp, slenp))
        {
            /* add this to the tag buffer if it fits */
            if (dst + 1 < tagbuf + MAX_TAG_SIZE)
                *dst++ = c;
        }
        
        /* null-terminate the tag name */
        *dst = '\0';
        
        /*
         *   Check to see if we recognize the tag.  We only recognize a few
         *   simple tags that map easily to character mode.  
         */
        if (CVmCaseFoldStr::wstreq(tagbuf, L"br"))
        {
            /* 
             *   line break - if there's anything buffered up, just flush the
             *   current line, otherwise write out a blank line 
             */
            if (html_in_ignore_)
                /* suppress in ignore mode */;
            else if (linepos_ != 0)
                html_defer_br_ = HTML_DEFER_BR_FLUSH;
            else
                html_defer_br_ = HTML_DEFER_BR_BLANK;
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"b")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"i")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"em")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"strong"))
        {
            /* suppress in ignore mode */
            if (!html_in_ignore_)
            {
                /* check to see if this is a start or end tag */
                if (!is_end_tag)
                {
                    int attr;

                    /* it's a start tag - push the current attributes */
                    push_color();

                    /* figure the attribute we're adding */
                    switch(tagbuf[0])
                    {
                    case 'b':
                    case 'B':
                        attr = OS_ATTR_BOLD;
                        break;

                    case 'i':
                    case 'I':
                        attr = OS_ATTR_ITALIC;
                        break;

                    case 'e':
                    case 'E':
                        attr = OS_ATTR_EM;
                        break;

                    case 's':
                    case 'S':
                        attr = OS_ATTR_STRONG;
                        break;
                    }

                    /* add the attribute */
                    cur_color_.attr |= attr;
                }
                else
                {
                    /* it's an end tag - just pop the saved attributes */
                    pop_color();
                }
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"p"))
        {
            /* paragraph - send out a blank line */
            if (!html_in_ignore_)
                write_blank_line(vmg0_);
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"tab") && !html_in_ignore_)
        {
            if (!html_in_ignore_)
            {
                /* if we have a pending tab, handle it */
                expand_pending_tab(vmg_ TRUE);

                /* start a tab definition */
                html_in_tab_ = TRUE;

                /* the new tab has no known characteristics yet */
                new_tab_entry_ = 0;
                new_tab_align_ = VMFMT_TAB_NONE;
                new_tab_dp_ = L'\0';
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"img")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"sound"))
        {
            /* IMG and SOUND - allow ALT attributes */
            html_allow_alt_ = TRUE;
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"font"))
        {
            /* FONT - look for COLOR attribute */
            if (html_in_ignore_)
            {
                /* do nothing while ignoring tags */
            }
            else if (!is_end_tag)
            {
                /* enable the COLOR attribute */
                html_allow_color_ = TRUE;

                /* push the current color, in case we change it */
                push_color();
            }
            else
            {
                /* restore the color in the enclosing text */
                pop_color();
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"body"))
        {
            /* BODY - look for BGCOLOR and TEXT attributes */
            if (!html_in_ignore_ && !is_end_tag)
            {
                /* note that we're parsing a BODY tag */
                html_in_body_ = TRUE;
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"hr"))
        {
            int rem;

            if (!html_in_ignore_)
            {
                /* start a new line */
                flush(vmg_ VM_NL_NEWLINE);

                /* write out underscores to the display width */
                for (rem = console_->get_line_width() - 1 ; rem > 0 ; )
                {
                    const size_t DASHBUFLEN = 100;
                    wchar_t dashbuf[DASHBUFLEN];
                    wchar_t *p;
                    size_t cur;

                    /* do as much as we can on this pass */
                    cur = rem;
                    if (cur > DASHBUFLEN - 1)
                        cur = DASHBUFLEN - 1;

                    /* deduct this from the total */
                    rem -= cur;

                    /* fill the buffer with dashes */
                    for (p = dashbuf ; cur != 0 ; --cur)
                        *p++ = '-';
                    *p = '\0';

                    /* write it out */
                    buffer_wstring(vmg_ dashbuf);
                }

                /* put a blank line after the underscores */
                write_blank_line(vmg0_);
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"q"))
        {
            wchar_t htmlchar;

            if (!html_in_ignore_)
            {
                /* if it's an open quote, increment the level */
                if (!is_end_tag)
                    ++html_quote_level_;

                /* add the open quote */
                htmlchar =
                    (!is_end_tag
                     ? ((html_quote_level_ & 1) == 1
                        ? 8220 : 8216)
                     : ((html_quote_level_ & 1) == 1
                        ? 8221 : 8217));

                /* write out the HTML quote character */
                buffer_char(vmg_ htmlchar);

                /* if it's a close quote, decrement the level */
                if (is_end_tag)
                    --html_quote_level_;
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"title"))
        {
            /* 
             *   Turn ignore mode on or off as appropriate, and turn on or
             *   off title mode as well.  
             */
            if (is_end_tag)
            {
                /* 
                 *   note that we're leaving an ignore section and a title
                 *   section 
                 */
                --html_in_ignore_;
                --html_in_title_;

                /*  
                 *   If we're no longer in a title, and we have a buffer
                 *   where we've gathered up the title string, call the OS
                 *   layer to tell it the title string, in case it wants to
                 *   change the window title or otherwise make use of the
                 *   title.  (Note that some streams don't bother keeping
                 *   track of the title at all, so we might not have a title
                 *   buffer.)  
                 */
                if (html_in_title_ == 0 && html_title_ptr_ != 0)
                {
                    /* null-terminate the title string */
                    *html_title_ptr_ = '\0';
                    
                    /* tell the OS about the title */
                    if (!html_in_ignore_)
                        set_title_in_os(html_title_buf_);
                }
            }
            else
            {
                /* 
                 *   if we aren't already in a title, set up to capture the
                 *   title into the title buffer 
                 */
                if (!html_in_title_)
                    html_title_ptr_ = html_title_buf_;
                
                /* 
                 *   note that we're in a title and in an ignore section,
                 *   since nothing within gets displayed 
                 */
                ++html_in_ignore_;
                ++html_in_title_;
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"aboutbox")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"banner"))
        {
            /* turn ignore mode on or off as appropriate */
            if (is_end_tag)
                --html_in_ignore_;
            else
                ++html_in_ignore_;
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"log"))
        {
            /* handle the <log> tag according to our stream subclass */
            process_log_tag(is_end_tag);
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"nolog"))
        {
            /* handle the <nolog> tag according to our stream subclass */
            process_nolog_tag(is_end_tag);
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"wrap"))
        {
            /* note that we have a 'wrap' tag to process */
            if (!html_in_ignore_)
                html_in_wrap_ = TRUE;
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"pre"))
        {
            /* count the nesting level if starting PRE mode */
            if (!is_end_tag)
                ++html_pre_level_;

            /* surround the PRE block with blank lines */
            write_blank_line(vmg0_);

            /* count the nesting level if ending PRE mode */
            if (is_end_tag && html_pre_level_ != 0)
                --html_pre_level_;
        }

        /* suppress everything up to the next '>' */
        html_parse_state_ = VMCON_HPS_TAG;

        /* 
         *   return the next character - since we're now in TAG mode, we'll
         *   resume the HTML mini-parser to parse the contents of the tag 
         */
        return c;
    }
    else if (c == '&')
    {
        /* parse the HTML markup */
        wchar_t ent;
        c = parse_entity(vmg_ &ent, sp, slenp);

        /* translate it and write it out */
        buffer_char(vmg_ ent);

        /* proceed with the next character */
        return c;
    }
    else
    {
        /* 
         *   we have nothing special to do with this character - simply
         *   buffer it and move on to the next character 
         */
        buffer_char(vmg_ c);
        return next_wchar(sp, slenp);
    }
}